

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.cpp
# Opt level: O2

void __thiscall Mutex::create_lock(Mutex *this)

{
  uint uVar1;
  int line;
  char *fmt;
  pthread_mutexattr_t attr;
  
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,2 - (uint)this->mRecursive);
  uVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)&attr);
  if (uVar1 != 0) {
    if (uVar1 == 0x16) {
      fmt = "pthread_mutex_init() failed with EINVAL";
      line = 0x9b;
    }
    else if (uVar1 == 0x10) {
      fmt = "pthread_mutex_init() failed with EBUSY";
      line = 0x99;
    }
    else {
      if (uVar1 != 0xb) {
        jh_log_print(1,"void Mutex::create_lock()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                     ,0x9d,"pthread_mutex_init() failed with %d",(ulong)uVar1);
        goto LAB_0011b028;
      }
      fmt = "pthread_mutex_init() failed with EAGAIN";
      line = 0x97;
    }
    jh_log_print(1,"void Mutex::create_lock()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                 ,line,fmt);
  }
LAB_0011b028:
  uVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
  if (uVar1 != 0) {
    if (uVar1 == 0x16) {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0xa5,"pthread_mutexattr_destroy() failed with EINVAL");
    }
    else {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0xa7,"pthread_mutexattr_destroy() failed with %d",(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void Mutex::create_lock()
{
	int res = 0;

	pthread_mutexattr_t attr;
	pthread_mutexattr_init( &attr );
	if ( mRecursive )
		res = pthread_mutexattr_settype( &attr, JH_PTHREAD_MUTEX_RECURSIVE );
	else
		res = pthread_mutexattr_settype( &attr, JH_PTHREAD_MUTEX_ERRORCHECK );
	
	// Initialize the mutex in the default state 
	res = pthread_mutex_init( &mMutex, &attr );

	if ( res )
	{
		if ( res == EAGAIN )
			LOG_ERR_FATAL("pthread_mutex_init() failed with EAGAIN");
		else if ( res == EBUSY )
			LOG_ERR_FATAL("pthread_mutex_init() failed with EBUSY");
		else if ( res == EINVAL )
			LOG_ERR_FATAL("pthread_mutex_init() failed with EINVAL");
		else
			LOG_ERR_FATAL("pthread_mutex_init() failed with %d", res);
	}

	res = pthread_mutexattr_destroy( &attr );

	if ( res )
	{
		if ( res == EINVAL )
			LOG_ERR_FATAL("pthread_mutexattr_destroy() failed with EINVAL");
		else
			LOG_ERR_FATAL("pthread_mutexattr_destroy() failed with %d", res);
	}
}